

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Degree_Generator.cc
# Opt level: O1

int __thiscall Degree_Generator::deg_generator(Degree_Generator *this,int v)

{
  uint32_t uVar1;
  long lVar2;
  
  uVar1 = 0xffffffff;
  if ((uint)v < 0x100000) {
    lVar2 = 1;
    do {
      if ((*(uint *)(lVar2 * 4 + 0x1241bc) <= (uint)v) && ((uint)v < f_table[lVar2]))
      goto LAB_00114b82;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 8);
    lVar2 = 8;
LAB_00114b82:
    if (8 < (uint)lVar2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Inconsistent table state",0x18);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
    }
    uVar1 = f_table[(long)(int)(uint)lVar2 + 7];
  }
  return uVar1;
}

Assistant:

int Degree_Generator::deg_generator(int v)
{
	int index_d = 0;
	int deg = 0;
	// v is a non-negative integer that is less than 2^^20 = 1048576
	// please refer to rfc6330 5.3.5.2 degree generator
	if ((v >= 1048576) || (v < 0) )
	{
		return -1;
	}

	// choose the degree: lookup the f_tabole
	for(index_d = 1; index_d < 8; index_d++)
	{
		if((f_table[index_d - 1] <= v) && (v < f_table[index_d]))
		{
		     break;
		}
	}

	if (index_d > 8)
	{
		std::cerr << "Inconsistent table state" << std::endl;
	}

	deg = d_table[index_d - 1];

	return deg;

}